

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinNFA.cpp
# Opt level: O1

list<int,_std::allocator<int>_> * __thiscall
la::LevenshteinNFA::Move
          (list<int,_std::allocator<int>_> *__return_storage_ptr__,LevenshteinNFA *this,
          list<int,_std::allocator<int>_> *states,char inp)

{
  size_t *psVar1;
  byte bVar2;
  int iVar3;
  pointer pcVar4;
  list<int,_std::allocator<int>_> *plVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  queue<int,_std::deque<int,_std::allocator<int>_>_> tmp;
  int local_9c;
  list<int,_std::allocator<int>_> *local_98;
  _List_node_base *local_90;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  p_Var7 = (states->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var7 == (_List_node_base *)states) {
    bVar12 = 0;
  }
  else {
    bVar12 = 0;
    local_98 = __return_storage_ptr__;
    local_90 = (_List_node_base *)states;
    do {
      uVar9 = this->_size;
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          lVar8 = (long)*(int *)&p_Var7[1]._M_next * uVar9;
          pcVar4 = (this->_transTable).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_transTable).super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pcVar4) <=
              lVar8 + uVar10) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          bVar2 = pcVar4[uVar10 + lVar8];
          if (bVar2 == inp || (bVar2 & 0xfd) == 0x7c) {
            p_Var6 = (_List_node_base *)operator_new(0x18);
            plVar5 = local_98;
            bVar11 = bVar12;
            if (bVar2 == inp) {
              bVar11 = 1;
            }
            if ((inp & 0xfdU) == 0x7c) {
              bVar11 = bVar12;
            }
            bVar12 = bVar11;
            *(int *)&p_Var6[1]._M_next = (int)uVar10;
            std::__detail::_List_node_base::_M_hook(p_Var6);
            psVar1 = &(plVar5->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
          }
          uVar10 = uVar10 + 1;
          uVar9 = this->_size;
        } while (uVar10 < uVar9);
      }
      p_Var7 = (((_List_base<int,_std::allocator<int>_> *)&p_Var7->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      __return_storage_ptr__ = local_98;
    } while (p_Var7 != local_90);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar3 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_9c = 0;
      uVar9 = this->_size;
      if (uVar9 != 0) {
        uVar10 = 0;
        do {
          uVar9 = uVar9 * (long)iVar3 + uVar10;
          pcVar4 = (this->_transTable).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_transTable).super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pcVar4) <= uVar9) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          if (pcVar4[uVar9] == '|') {
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,&local_9c);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int)uVar10;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            p_Var7 = (_List_node_base *)operator_new(0x18);
            *(int *)&p_Var7[1]._M_next = local_9c;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            psVar1 = &(__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl.
                      _M_node._M_size;
            *psVar1 = *psVar1 + 1;
          }
          uVar10 = (long)local_9c + 1;
          local_9c = (int)uVar10;
          uVar9 = this->_size;
        } while (uVar10 < uVar9);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (!(bool)((inp & 0xfdU) == 0x7c | bVar12)) {
    std::__cxx11::list<int,_std::allocator<int>_>::clear(__return_storage_ptr__);
  }
  std::__cxx11::list<int,_std::allocator<int>_>::sort(__return_storage_ptr__);
  std::__cxx11::list<int,_std::allocator<int>_>::unique(__return_storage_ptr__);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::list<int> LevenshteinNFA::Move(const std::list<int> &states, char inp) const
    {
        std::list<int> result;
        std::queue<int> tmp;
        bool needNormalLetter = false;
        bool findNormalLetter = false;
        if (inp != (char)LevenshteinNFA::Constants::Insertion &&
            inp != (char)LevenshteinNFA::Constants::Deletion)
            needNormalLetter = true;
        for (auto it = std::begin(states); it != std::end(states); ++it)
        {
            for (decltype(_size) j = 0; j < _size; j++)
            {
                char c = _transTable.at((*it * _size) + j);
                if (c == inp || c == (char)LevenshteinNFA::Constants::Insertion || c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    if (needNormalLetter && c == inp)
                        findNormalLetter = true;
                    result.push_back(j);
                }
            }
        }
        while (!tmp.empty())
        {
            int now = tmp.front();
            tmp.pop();
            for (int j = 0; j < _size; j++)
            {
                char c = _transTable.at((now * _size) + j);
                if (c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    tmp.push(j);
                    result.push_back(j);
                }
            }
        }
        if (needNormalLetter && !findNormalLetter)
            result.clear();
        result.sort();
        result.unique();
        return result;
    }